

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

Table * luaH_new(lua_State *L,int narray,int nhash)

{
  GCObject *o;
  Table *t;
  int nhash_local;
  int narray_local;
  lua_State *L_local;
  
  o = (GCObject *)luaM_realloc_(L,(void *)0x0,0,0x40);
  luaC_link(L,o,'\x05');
  (o->h).metatable = (Table *)0x0;
  (o->h).flags = 0xff;
  (o->h).array = (TValue *)0x0;
  (o->h).sizearray = 0;
  (o->h).lsizenode = '\0';
  (o->h).node = &dummynode_;
  setarrayvector(L,&o->h,narray);
  setnodevector(L,&o->h,nhash);
  return (Table *)o;
}

Assistant:

static Table*luaH_new(lua_State*L,int narray,int nhash){
Table*t=luaM_new(L,Table);
luaC_link(L,obj2gco(t),5);
t->metatable=NULL;
t->flags=cast_byte(~0);
t->array=NULL;
t->sizearray=0;
t->lsizenode=0;
t->node=cast(Node*,(&dummynode_));
setarrayvector(L,t,narray);
setnodevector(L,t,nhash);
return t;
}